

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::enter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxId *enterId,bool polish)

{
  uint *puVar1;
  undefined8 *puVar2;
  double a;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  pointer pUVar7;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  int *piVar9;
  pointer pnVar10;
  pointer pnVar11;
  Item *pIVar12;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar13;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar14;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar15;
  uint uVar16;
  uint uVar17;
  undefined8 uVar18;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar19;
  int32_t iVar20;
  undefined1 auVar21 [16];
  DataKey *pDVar22;
  bool bVar23;
  bool bVar24;
  int iVar25;
  uint uVar26;
  undefined4 extraout_var;
  double *pdVar27;
  SPxOut *pSVar28;
  _func_int **pp_Var29;
  cpp_dec_float<50U,_int,_void> *pcVar30;
  long lVar31;
  undefined7 in_register_00000011;
  cpp_dec_float<50U,_int,_void> *pcVar32;
  ulong uVar33;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar34;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar35;
  DataKey DVar36;
  long lVar37;
  uint uVar38;
  cpp_dec_float<50u,int,void> *pcVar39;
  undefined8 uVar40;
  ulong uVar41;
  Real RVar42;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Status enterStat;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_7b8;
  DataKey *local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  SPxId none;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterTest;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterMax;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterVal;
  cpp_dec_float<50U,_int,_void> local_5f8;
  undefined8 local_5c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterRO;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  uint local_518 [6];
  undefined5 uStack_500;
  undefined3 uStack_4fb;
  undefined5 local_4f8;
  undefined3 uStack_4f3;
  int local_4f0;
  undefined1 local_4ec;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterLB;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterUB;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  undefined8 local_3e8;
  uint auStack_3e0 [4];
  undefined5 uStack_3d0;
  undefined3 uStack_3cb;
  uint local_3c8;
  undefined3 uStack_3c3;
  int local_3c0;
  byte local_3bc;
  undefined8 local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  uint local_328 [2];
  uint auStack_320 [2];
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  undefined8 local_308;
  int local_300;
  undefined1 local_2fc;
  fpclass_type local_2f8;
  int32_t iStack_2f4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  uint local_2a8 [2];
  uint auStack_2a0 [2];
  uint local_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  undefined8 local_288;
  int local_280;
  undefined1 local_27c;
  fpclass_type local_278;
  int32_t iStack_274;
  cpp_dec_float<50U,_int,_void> local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8 [2];
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  undefined8 local_148;
  int local_140;
  undefined1 local_13c;
  fpclass_type local_138;
  int32_t iStack_134;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  fpclass_type local_78;
  int32_t iStack_74;
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rhs;
  
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  enterTest.m_backend.fpclass = cpp_dec_float_finite;
  enterTest.m_backend.prec_elem = 10;
  enterTest.m_backend.data._M_elems[0] = 0;
  enterTest.m_backend.data._M_elems[1] = 0;
  enterTest.m_backend.data._M_elems[2] = 0;
  enterTest.m_backend.data._M_elems[3] = 0;
  enterTest.m_backend.data._M_elems[4] = 0;
  enterTest.m_backend.data._M_elems[5] = 0;
  enterTest.m_backend.data._M_elems[6] = 0;
  enterTest.m_backend.data._M_elems[7] = 0;
  enterTest.m_backend.data._M_elems._32_5_ = 0;
  enterTest.m_backend.data._M_elems[9]._1_3_ = 0;
  enterTest.m_backend.exp = 0;
  enterTest.m_backend.neg = false;
  enterUB.m_backend.fpclass = cpp_dec_float_finite;
  enterUB.m_backend.prec_elem = 10;
  enterUB.m_backend.data._M_elems[0] = 0;
  enterUB.m_backend.data._M_elems[1] = 0;
  enterUB.m_backend.data._M_elems[2] = 0;
  enterUB.m_backend.data._M_elems[3] = 0;
  enterUB.m_backend.data._M_elems[4] = 0;
  enterUB.m_backend.data._M_elems[5] = 0;
  enterUB.m_backend.data._M_elems._24_5_ = 0;
  enterUB.m_backend.data._M_elems[7]._1_3_ = 0;
  enterUB.m_backend.data._M_elems._32_5_ = 0;
  enterUB.m_backend.data._M_elems[9]._1_3_ = 0;
  enterUB.m_backend.exp = 0;
  enterUB.m_backend.neg = false;
  enterLB.m_backend.fpclass = cpp_dec_float_finite;
  enterLB.m_backend.prec_elem = 10;
  enterLB.m_backend.data._M_elems[0] = 0;
  enterLB.m_backend.data._M_elems[1] = 0;
  enterLB.m_backend.data._M_elems[2] = 0;
  enterLB.m_backend.data._M_elems[3] = 0;
  enterLB.m_backend.data._M_elems[4] = 0;
  enterLB.m_backend.data._M_elems[5] = 0;
  enterLB.m_backend.data._M_elems._24_5_ = 0;
  enterLB.m_backend.data._M_elems[7]._1_3_ = 0;
  enterLB.m_backend.data._M_elems._32_5_ = 0;
  enterLB.m_backend.data._M_elems[9]._1_3_ = 0;
  enterLB.m_backend.exp = 0;
  enterLB.m_backend.neg = false;
  enterVal.m_backend.fpclass = cpp_dec_float_finite;
  enterVal.m_backend.prec_elem = 10;
  enterVal.m_backend.data._M_elems[0] = 0;
  enterVal.m_backend.data._M_elems[1] = 0;
  enterVal.m_backend.data._M_elems[2] = 0;
  enterVal.m_backend.data._M_elems[3] = 0;
  enterVal.m_backend.data._M_elems[4] = 0;
  enterVal.m_backend.data._M_elems[5] = 0;
  enterVal.m_backend.data._M_elems._24_5_ = 0;
  enterVal.m_backend.data._M_elems[7]._1_3_ = 0;
  enterVal.m_backend.data._M_elems._32_5_ = 0;
  enterVal.m_backend.data._M_elems[9]._1_3_ = 0;
  enterVal.m_backend.exp = 0;
  enterVal.m_backend.neg = false;
  enterMax.m_backend.fpclass = cpp_dec_float_finite;
  enterMax.m_backend.prec_elem = 10;
  enterMax.m_backend.data._M_elems[0] = 0;
  enterMax.m_backend.data._M_elems[1] = 0;
  enterMax.m_backend.data._M_elems[2] = 0;
  enterMax.m_backend.data._M_elems[3] = 0;
  enterMax.m_backend.data._M_elems[4] = 0;
  enterMax.m_backend.data._M_elems[5] = 0;
  enterMax.m_backend.data._M_elems[6] = 0;
  enterMax.m_backend.data._M_elems[7] = 0;
  enterMax.m_backend.data._M_elems._32_5_ = 0;
  enterMax.m_backend.data._M_elems[9]._1_3_ = 0;
  enterMax.m_backend.exp = 0;
  enterMax.m_backend.neg = false;
  local_5f8.fpclass = cpp_dec_float_finite;
  local_5f8.prec_elem = 10;
  local_5f8.data._M_elems[0] = 0;
  local_5f8.data._M_elems[1] = 0;
  local_5f8.data._M_elems[2] = 0;
  local_5f8.data._M_elems[3] = 0;
  local_5f8.data._M_elems[4] = 0;
  local_5f8.data._M_elems[5] = 0;
  local_5f8.data._M_elems._24_5_ = 0;
  local_5f8.data._M_elems[7]._1_3_ = 0;
  local_5f8.data._M_elems._32_5_ = 0;
  local_5f8.data._M_elems[9]._1_3_ = 0;
  local_5f8.exp = 0;
  local_5f8.neg = false;
  enterRO.m_backend.fpclass = cpp_dec_float_finite;
  enterRO.m_backend.prec_elem = 10;
  enterRO.m_backend.data._M_elems[0] = 0;
  enterRO.m_backend.data._M_elems[1] = 0;
  enterRO.m_backend.data._M_elems[2] = 0;
  enterRO.m_backend.data._M_elems[3] = 0;
  enterRO.m_backend.data._M_elems[4] = 0;
  enterRO.m_backend.data._M_elems[5] = 0;
  enterRO.m_backend.data._M_elems._24_5_ = 0;
  enterRO.m_backend.data._M_elems[7]._1_3_ = 0;
  enterRO.m_backend.data._M_elems._32_5_ = 0;
  enterRO.m_backend.data._M_elems[9]._1_3_ = 0;
  enterRO.m_backend.exp = 0;
  enterRO.m_backend.neg = false;
  local_4e8._0_4_ = cpp_dec_float_finite;
  local_4e8._4_4_ = 10;
  local_518[0] = 0;
  local_518[1] = 0;
  local_518[2] = 0;
  local_518[3] = 0;
  local_518[4] = 0;
  local_518[5] = 0;
  uStack_500 = 0;
  uStack_4fb = 0;
  local_4f8 = 0;
  uStack_4f3 = 0;
  local_4f0 = 0;
  local_4ec = 0;
  iVar25 = (*(this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._vptr_ClassArray[0x7e])();
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(extraout_var,iVar25);
  bVar24 = this->instableEnter;
  local_7b0 = &enterId->super_DataKey;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,&local_5f8
             ,&enterStat,&enterRO,local_518);
  uVar40 = result.m_backend._48_8_;
  if ((int)CONCAT71(in_register_00000011,polish) == 0) {
    RVar42 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    enterId = (SPxId *)&result_1;
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)enterId,RVar42);
    result.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    auVar21 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
    result.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
    result.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
    result.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
    result.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
    result.m_backend.exp = result_1.m_backend.exp;
    result.m_backend.neg = result_1.m_backend.neg;
    uVar40._0_4_ = result_1.m_backend.fpclass;
    uVar40._4_4_ = result_1.m_backend.prec_elem;
    result.m_backend.fpclass = result_1.m_backend.fpclass;
    result.m_backend.prec_elem = result_1.m_backend.prec_elem;
    result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    if (result.m_backend.data._M_elems[0] != 0 || result_1.m_backend.fpclass != cpp_dec_float_finite
       ) {
      result.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
    }
    result.m_backend.data._M_elems._0_16_ = auVar21;
    if (((result_1.m_backend.fpclass == cpp_dec_float_NaN) ||
        (uVar40 = result.m_backend._48_8_, enterTest.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&enterTest.m_backend,&result.m_backend),
       uVar40 = result.m_backend._48_8_, iVar25 < 1)) goto LAB_00282012;
    local_48 = CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                        enterTest.m_backend.data._M_elems._32_5_);
    local_58 = enterTest.m_backend.data._M_elems[4];
    uStack_54 = enterTest.m_backend.data._M_elems[5];
    uStack_50 = enterTest.m_backend.data._M_elems[6];
    uStack_4c = enterTest.m_backend.data._M_elems[7];
    local_68[0] = enterTest.m_backend.data._M_elems[0];
    local_68[1] = enterTest.m_backend.data._M_elems[1];
    auStack_60[0] = enterTest.m_backend.data._M_elems[2];
    auStack_60[1] = enterTest.m_backend.data._M_elems[3];
    local_40 = enterTest.m_backend.exp;
    local_3c = enterTest.m_backend.neg;
    local_38 = enterTest.m_backend.fpclass;
    iStack_34 = enterTest.m_backend.prec_elem;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x84])(this,*local_7b0,local_68,(ulong)(uint)enterStat);
    pp_Var29 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
    uVar40 = 0;
  }
  else {
LAB_00282012:
    result.m_backend._48_8_ = uVar40;
    pUVar34 = this->theFvec;
    if (((pUVar34->thedelta).setupStatus == true) && ((pUVar34->thedelta).super_IdxSet.num == 0)) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solve4update(&this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,&pUVar34->thedelta,rhs);
    }
    if ((!polish) && (this->m_maxCycle < this->m_numCycle)) {
      result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
      result_1.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
      uVar40 = result_1.m_backend.data._M_elems._0_8_;
      result_1.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
      result_1.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
      result_1.m_backend.data._M_elems._32_5_ = enterMax.m_backend.data._M_elems._32_5_;
      result_1.m_backend.data._M_elems[9]._1_3_ = enterMax.m_backend.data._M_elems[9]._1_3_;
      result_1.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
      result_1.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
      result_1.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
      result_1.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
      result_1.m_backend.exp = enterMax.m_backend.exp;
      result_1.m_backend.neg = enterMax.m_backend.neg;
      result_1.m_backend.fpclass = enterMax.m_backend.fpclass;
      result_1.m_backend.prec_elem = enterMax.m_backend.prec_elem;
      result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
      if (result_1.m_backend.data._M_elems[0] != 0 ||
          enterMax.m_backend.fpclass != cpp_dec_float_finite) {
        result_1.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
      }
      pcVar39 = (cpp_dec_float<50u,int,void> *)enterId;
      result_1.m_backend.data._M_elems._0_8_ = uVar40;
      if (enterMax.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002820dc:
        lVar31 = 0x448;
        enterId = (SPxId *)pcVar39;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&result.m_backend,0,(type *)0x0);
        iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&result_1.m_backend,&result.m_backend);
        lVar31 = 0x450;
        pcVar39 = (cpp_dec_float<50u,int,void> *)&result;
        enterId = (SPxId *)&result;
        if (iVar25 < 1) goto LAB_002820dc;
      }
      (**(code **)((long)(this->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._vptr_ClassArray + lVar31))(this);
    }
    result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
    uVar40 = result_1.m_backend.data._M_elems._0_8_;
    result_1.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
    result_1.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
    result_1.m_backend.data._M_elems._32_5_ = enterMax.m_backend.data._M_elems._32_5_;
    result_1.m_backend.data._M_elems[9]._1_3_ = enterMax.m_backend.data._M_elems[9]._1_3_;
    result_1.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
    result_1.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
    result_1.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
    result_1.m_backend.exp = enterMax.m_backend.exp;
    result_1.m_backend.neg = enterMax.m_backend.neg;
    result_1.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_1.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
        result_1.m_backend.data._M_elems[0] != 0) {
      result_1.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    this->boundflips = 0;
    local_88 = CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                        enterTest.m_backend.data._M_elems._32_5_);
    local_98 = enterTest.m_backend.data._M_elems[4];
    uStack_94 = enterTest.m_backend.data._M_elems[5];
    uStack_90 = enterTest.m_backend.data._M_elems[6];
    uStack_8c = enterTest.m_backend.data._M_elems[7];
    local_a8[0] = enterTest.m_backend.data._M_elems[0];
    local_a8[1] = enterTest.m_backend.data._M_elems[1];
    auStack_a0[0] = enterTest.m_backend.data._M_elems[2];
    auStack_a0[1] = enterTest.m_backend.data._M_elems[3];
    local_80 = enterTest.m_backend.exp;
    local_7c = enterTest.m_backend.neg;
    local_78 = enterTest.m_backend.fpclass;
    iStack_74 = enterTest.m_backend.prec_elem;
    result_1.m_backend.data._M_elems._0_8_ = uVar40;
    uVar26 = (*this->theratiotester->_vptr_SPxRatioTester[7])();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(this->instableEnterVal).m_backend,0);
    (this->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
    this->instableEnter = false;
    uVar40 = CONCAT71((int7)((ulong)enterId >> 8),-1 < (int)uVar26);
    local_7b8 = this;
    if (-1 < (int)uVar26) {
      result.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
      result.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
      result.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
      result.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      auVar21 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
      result.m_backend.exp = result_1.m_backend.exp;
      result.m_backend.neg = result_1.m_backend.neg;
      result.m_backend.fpclass = result_1.m_backend.fpclass;
      result.m_backend.prec_elem = result_1.m_backend.prec_elem;
      if ((result_1.m_backend.neg == true) &&
         (result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0],
         result_1.m_backend.fpclass != cpp_dec_float_finite ||
         result.m_backend.data._M_elems[0] != 0)) {
        result.m_backend.neg = false;
      }
      result.m_backend.data._M_elems._0_16_ = auVar21;
      entertol(&leavebound,this);
      local_5c0 = uVar40;
      if (((result.m_backend.fpclass == cpp_dec_float_NaN) ||
          (leavebound.m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&result.m_backend,&leavebound.m_backend), -1 < iVar25)) {
        this->m_numCycle = this->m_numCycle / 2;
      }
      else {
        pnVar10 = (this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[uVar26].m_backend.data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[uVar26].m_backend.data;
        local_e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[uVar26].m_backend.data._M_elems + 2);
        puVar1 = pnVar10[uVar26].m_backend.data._M_elems + 4;
        local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_e8.m_backend.exp = pnVar10[uVar26].m_backend.exp;
        local_e8.m_backend.neg = pnVar10[uVar26].m_backend.neg;
        local_e8.m_backend.fpclass = pnVar10[uVar26].m_backend.fpclass;
        local_e8.m_backend.prec_elem = pnVar10[uVar26].m_backend.prec_elem;
        pnVar10 = (this->theLBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[uVar26].m_backend.data._M_elems + 8);
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[uVar26].m_backend.data;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[uVar26].m_backend.data._M_elems + 2);
        puVar1 = pnVar10[uVar26].m_backend.data._M_elems + 4;
        local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_128.m_backend.exp = pnVar10[uVar26].m_backend.exp;
        local_128.m_backend.neg = pnVar10[uVar26].m_backend.neg;
        local_128.m_backend.fpclass = pnVar10[uVar26].m_backend.fpclass;
        local_128.m_backend.prec_elem = pnVar10[uVar26].m_backend.prec_elem;
        RVar42 = Tolerances::epsilon((this->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        bVar24 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_e8,&local_128,RVar42);
        if (((bVar24) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
          this->m_numCycle = this->m_numCycle + 1;
          this->enterCycles = this->enterCycles + 1;
        }
      }
      pSVar3 = this->coSolveVector3;
      if (pSVar3 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x0) {
LAB_00282900:
        pSVar3 = this->coSolveVector2;
        if (pSVar3 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x0) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(&this->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,&this->theCoPvec->thedelta,
                    &(this->unitVecs).data.
                     super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar26].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
        }
        else {
          pUVar34 = this->theCoPvec;
          pSVar4 = this->coSolveVector2rhs;
          pUVar7 = (this->unitVecs).data.
                   super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).factorized == false) {
            SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::factorize(&this->
                         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       );
          }
          pSVar8 = (this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).factor;
          (*pSVar8->_vptr_SLinSolver[0x18])(pSVar8,&pUVar34->thedelta,pSVar3,pUVar7 + uVar26,pSVar4)
          ;
        }
      }
      else {
        pSVar4 = this->coSolveVector2;
        if (pSVar4 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x0) {
          if (pSVar3 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x0) goto LAB_00282900;
          pUVar34 = this->theCoPvec;
          pSVar4 = this->coSolveVector3rhs;
          pUVar7 = (this->unitVecs).data.
                   super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).factorized == false) {
            SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::factorize(&this->
                         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       );
          }
          pSVar8 = (this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).factor;
          (*pSVar8->_vptr_SLinSolver[0x18])(pSVar8,&pUVar34->thedelta,pSVar3,pUVar7 + uVar26,pSVar4)
          ;
          pSVar3 = this->coSolveVector3;
          pUVar34 = this->theCoPvec;
          if (pSVar3->setupStatus == true) {
            lVar31 = (long)(pSVar3->super_IdxSet).num;
            if (0 < lVar31) {
              lVar31 = lVar31 + 1;
              do {
                piVar9 = (pSVar3->super_IdxSet).idx;
                pnVar10 = (pSVar3->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar25 = piVar9[lVar31 + -2];
                uVar40 = *(undefined8 *)(pnVar10[iVar25].m_backend.data._M_elems + 8);
                result.m_backend.data._M_elems._32_5_ = SUB85(uVar40,0);
                result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar40 >> 0x28);
                result.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])&pnVar10[iVar25].m_backend.data;
                puVar1 = pnVar10[iVar25].m_backend.data._M_elems + 4;
                uVar40 = *(undefined8 *)puVar1;
                uVar18 = *(undefined8 *)(puVar1 + 2);
                result.m_backend.data._M_elems[4] = (uint)uVar40;
                result.m_backend.data._M_elems[5] = (uint)((ulong)uVar40 >> 0x20);
                result.m_backend.data._M_elems[6] = (uint)uVar18;
                result.m_backend.data._M_elems[7] = (uint)((ulong)uVar18 >> 0x20);
                result.m_backend.exp = pnVar10[iVar25].m_backend.exp;
                result.m_backend.neg = pnVar10[iVar25].m_backend.neg;
                result.m_backend.fpclass = pnVar10[iVar25].m_backend.fpclass;
                result.m_backend.prec_elem = pnVar10[iVar25].m_backend.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&(pUVar34->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[piVar9[lVar31 + -2]].m_backend
                           ,&result.m_backend);
                lVar31 = lVar31 + -1;
              } while (1 < lVar31);
            }
          }
          else {
            uVar38 = (int)((long)(pUVar34->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pUVar34->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
            if (0 < (int)uVar38) {
              uVar33 = (ulong)(uVar38 & 0x7fffffff);
              lVar37 = uVar33 + 1;
              lVar31 = uVar33 * 0x38;
              do {
                pnVar10 = (pSVar3->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar40 = *(undefined8 *)((long)pnVar10[-1].m_backend.data._M_elems + lVar31 + 0x20);
                result.m_backend.data._M_elems._32_5_ = SUB85(uVar40,0);
                result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar40 >> 0x28);
                result.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])((long)pnVar10[-1].m_backend.data._M_elems + lVar31);
                puVar2 = (undefined8 *)((long)pnVar10[-1].m_backend.data._M_elems + lVar31 + 0x10);
                uVar40 = *puVar2;
                uVar18 = puVar2[1];
                result.m_backend.data._M_elems[4] = (uint)uVar40;
                result.m_backend.data._M_elems[5] = (uint)((ulong)uVar40 >> 0x20);
                result.m_backend.data._M_elems[6] = (uint)uVar18;
                result.m_backend.data._M_elems[7] = (uint)((ulong)uVar18 >> 0x20);
                result.m_backend.exp = *(int *)((long)(&pnVar10[-1].m_backend.data + 1) + lVar31);
                result.m_backend.neg =
                     *(bool *)((long)(&pnVar10[-1].m_backend.data + 1) + lVar31 + 4U);
                result.m_backend._48_8_ =
                     *(undefined8 *)((long)(&pnVar10[-1].m_backend.data + 1) + lVar31 + 8U);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)
                           ((long)(pUVar34->
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                                  m_backend.data._M_elems + lVar31),&result.m_backend);
                lVar37 = lVar37 + -1;
                lVar31 = lVar31 + -0x38;
              } while (1 < lVar37);
            }
          }
        }
        else {
          pUVar34 = this->theCoPvec;
          pSVar5 = this->coSolveVector2rhs;
          pSVar6 = this->coSolveVector3rhs;
          pUVar7 = (this->unitVecs).data.
                   super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).factorized == false) {
            SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::factorize(&this->
                         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       );
          }
          pSVar8 = (this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).factor;
          (*pSVar8->_vptr_SLinSolver[0x1a])
                    (pSVar8,&pUVar34->thedelta,pSVar4,pSVar3,pUVar7 + uVar26,pSVar5,pSVar6);
          pSVar3 = this->coSolveVector3;
          pUVar34 = this->theCoPvec;
          if (pSVar3->setupStatus == true) {
            lVar31 = (long)(pSVar3->super_IdxSet).num;
            if (0 < lVar31) {
              lVar31 = lVar31 + 1;
              do {
                piVar9 = (pSVar3->super_IdxSet).idx;
                pnVar10 = (pSVar3->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar25 = piVar9[lVar31 + -2];
                uVar40 = *(undefined8 *)(pnVar10[iVar25].m_backend.data._M_elems + 8);
                result.m_backend.data._M_elems._32_5_ = SUB85(uVar40,0);
                result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar40 >> 0x28);
                result.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])&pnVar10[iVar25].m_backend.data;
                puVar1 = pnVar10[iVar25].m_backend.data._M_elems + 4;
                uVar40 = *(undefined8 *)puVar1;
                uVar18 = *(undefined8 *)(puVar1 + 2);
                result.m_backend.data._M_elems[4] = (uint)uVar40;
                result.m_backend.data._M_elems[5] = (uint)((ulong)uVar40 >> 0x20);
                result.m_backend.data._M_elems[6] = (uint)uVar18;
                result.m_backend.data._M_elems[7] = (uint)((ulong)uVar18 >> 0x20);
                result.m_backend.exp = pnVar10[iVar25].m_backend.exp;
                result.m_backend.neg = pnVar10[iVar25].m_backend.neg;
                result.m_backend.fpclass = pnVar10[iVar25].m_backend.fpclass;
                result.m_backend.prec_elem = pnVar10[iVar25].m_backend.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&(pUVar34->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[piVar9[lVar31 + -2]].m_backend
                           ,&result.m_backend);
                lVar31 = lVar31 + -1;
              } while (1 < lVar31);
            }
          }
          else {
            uVar38 = (int)((long)(pUVar34->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pUVar34->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
            if (0 < (int)uVar38) {
              uVar33 = (ulong)(uVar38 & 0x7fffffff);
              lVar37 = uVar33 + 1;
              lVar31 = uVar33 * 0x38;
              do {
                pnVar10 = (pSVar3->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar40 = *(undefined8 *)((long)pnVar10[-1].m_backend.data._M_elems + lVar31 + 0x20);
                result.m_backend.data._M_elems._32_5_ = SUB85(uVar40,0);
                result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar40 >> 0x28);
                result.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])((long)pnVar10[-1].m_backend.data._M_elems + lVar31);
                puVar2 = (undefined8 *)((long)pnVar10[-1].m_backend.data._M_elems + lVar31 + 0x10);
                uVar40 = *puVar2;
                uVar18 = puVar2[1];
                result.m_backend.data._M_elems[4] = (uint)uVar40;
                result.m_backend.data._M_elems[5] = (uint)((ulong)uVar40 >> 0x20);
                result.m_backend.data._M_elems[6] = (uint)uVar18;
                result.m_backend.data._M_elems[7] = (uint)((ulong)uVar18 >> 0x20);
                result.m_backend.exp = *(int *)((long)(&pnVar10[-1].m_backend.data + 1) + lVar31);
                result.m_backend.neg =
                     *(bool *)((long)(&pnVar10[-1].m_backend.data + 1) + lVar31 + 4U);
                result.m_backend._48_8_ =
                     *(undefined8 *)((long)(&pnVar10[-1].m_backend.data + 1) + lVar31 + 8U);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)
                           ((long)(pUVar34->
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                                  m_backend.data._M_elems + lVar31),&result.m_backend);
                lVar37 = lVar37 + -1;
                lVar31 = lVar31 + -0x38;
              } while (1 < lVar37);
            }
          }
        }
      }
      pSVar35 = local_7b8;
      if (0 < local_7b8->boundflips) {
        uVar38 = (int)((long)(local_7b8->coSolveVector3->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_7b8->coSolveVector3->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
        if (0 < (int)uVar38) {
          uVar33 = (ulong)(uVar38 & 0x7fffffff);
          do {
            uVar41 = uVar33 - 1;
            pnVar11 = (pSVar35->coSolveVector3->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_4b8 = *(undefined8 *)(pnVar11[uVar41].m_backend.data._M_elems + 8);
            pnVar10 = pnVar11 + uVar41;
            local_4d8 = *(undefined8 *)(pnVar10->m_backend).data._M_elems;
            uStack_4d0 = *(undefined8 *)((pnVar10->m_backend).data._M_elems + 2);
            puVar1 = pnVar11[uVar41].m_backend.data._M_elems + 4;
            local_4c8 = *(undefined8 *)puVar1;
            uStack_4c0 = *(undefined8 *)(puVar1 + 2);
            result.m_backend.exp = pnVar11[uVar41].m_backend.exp;
            result.m_backend.neg = pnVar11[uVar41].m_backend.neg;
            result.m_backend.fpclass = pnVar11[uVar41].m_backend.fpclass;
            result.m_backend.prec_elem = pnVar11[uVar41].m_backend.prec_elem;
            result.m_backend.data._M_elems._32_5_ = SUB85(local_4b8,0);
            result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_4b8 >> 0x28);
            result.m_backend.data._M_elems[4] = (uint)local_4c8;
            result.m_backend.data._M_elems[5] = (uint)((ulong)local_4c8 >> 0x20);
            result.m_backend.data._M_elems[6] = (uint)uStack_4c0;
            result.m_backend.data._M_elems[7] = (uint)((ulong)uStack_4c0 >> 0x20);
            if ((result.m_backend.neg == true) &&
               (result.m_backend.data._M_elems[0] = (uint)local_4d8,
               result.m_backend.fpclass != cpp_dec_float_finite ||
               result.m_backend.data._M_elems[0] != 0)) {
              result.m_backend.neg = false;
            }
            result.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])&(pnVar10->m_backend).data
            ;
            RVar42 = Tolerances::epsilon((pSVar35->
                                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         )._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            leavebound.m_backend.fpclass = cpp_dec_float_finite;
            leavebound.m_backend.prec_elem = 10;
            leavebound.m_backend.data._M_elems[0] = 0;
            leavebound.m_backend.data._M_elems[1] = 0;
            leavebound.m_backend.data._M_elems[2] = 0;
            leavebound.m_backend.data._M_elems[3] = 0;
            leavebound.m_backend.data._M_elems[4] = 0;
            leavebound.m_backend.data._M_elems[5] = 0;
            leavebound.m_backend.data._M_elems[6] = 0;
            leavebound.m_backend.data._M_elems[7] = 0;
            leavebound.m_backend.data._M_elems._32_5_ = 0;
            leavebound.m_backend.data._M_elems[9]._1_3_ = 0;
            leavebound.m_backend.exp = 0;
            leavebound.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&leavebound,RVar42);
            if (((result.m_backend.fpclass != cpp_dec_float_NaN) &&
                (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
               (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&result.m_backend,&leavebound.m_backend), 0 < iVar25)) {
              pUVar34 = pSVar35->thePvec;
              pnVar10 = (pSVar35->coSolveVector3->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              leavebound.m_backend.exp = pnVar10[uVar41].m_backend.exp;
              leavebound.m_backend.neg = pnVar10[uVar41].m_backend.neg;
              leavebound.m_backend.fpclass = pnVar10[uVar41].m_backend.fpclass;
              leavebound.m_backend.prec_elem = pnVar10[uVar41].m_backend.prec_elem;
              uVar40 = *(undefined8 *)(pnVar10[uVar41].m_backend.data._M_elems + 8);
              leavebound.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)&pnVar10[uVar41].m_backend.data;
              leavebound.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)(pnVar10[uVar41].m_backend.data._M_elems + 2);
              puVar1 = pnVar10[uVar41].m_backend.data._M_elems + 4;
              leavebound.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              uVar18 = *(undefined8 *)(puVar1 + 2);
              leavebound.m_backend.data._M_elems._32_5_ = SUB85(uVar40,0);
              leavebound.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar40 >> 0x28);
              leavebound.m_backend.data._M_elems[6] = (uint)uVar18;
              leavebound.m_backend.data._M_elems[7] = (uint)((ulong)uVar18 >> 0x20);
              if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
                  leavebound.m_backend.data._M_elems[0] != 0) {
                leavebound.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
              }
              pIVar12 = (pSVar35->thecovectors->set).theitem;
              iVar25 = (pSVar35->thecovectors->set).thekey[uVar41].idx;
              lVar31 = (long)pIVar12[iVar25].data.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .memused;
              pSVar35 = local_7b8;
              if (0 < lVar31) {
                pIVar12 = pIVar12 + iVar25;
                lVar37 = lVar31 + 1;
                lVar31 = lVar31 * 0x3c;
                do {
                  pcVar30 = (cpp_dec_float<50U,_int,_void> *)
                            ((long)(pIVar12->data).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem[-1].val.m_backend.data._M_elems + lVar31);
                  result.m_backend.fpclass = cpp_dec_float_finite;
                  result.m_backend.prec_elem = 10;
                  result.m_backend.data._M_elems[0] = 0;
                  result.m_backend.data._M_elems[1] = 0;
                  result.m_backend.data._M_elems[2] = 0;
                  result.m_backend.data._M_elems[3] = 0;
                  result.m_backend.data._M_elems[4] = 0;
                  result.m_backend.data._M_elems[5] = 0;
                  result.m_backend.data._M_elems[6] = 0;
                  result.m_backend.data._M_elems[7] = 0;
                  result.m_backend.data._M_elems._32_5_ = 0;
                  result.m_backend.data._M_elems[9]._1_3_ = 0;
                  result.m_backend.exp = 0;
                  result.m_backend.neg = false;
                  pcVar32 = &leavebound.m_backend;
                  if (pcVar30 != &result.m_backend) {
                    result.m_backend.data._M_elems._32_5_ =
                         leavebound.m_backend.data._M_elems._32_5_;
                    result.m_backend.data._M_elems[9]._1_3_ =
                         leavebound.m_backend.data._M_elems[9]._1_3_;
                    result.m_backend.data._M_elems[4] = leavebound.m_backend.data._M_elems[4];
                    result.m_backend.data._M_elems[5] = leavebound.m_backend.data._M_elems[5];
                    result.m_backend.data._M_elems[6] = leavebound.m_backend.data._M_elems[6];
                    result.m_backend.data._M_elems[7] = leavebound.m_backend.data._M_elems[7];
                    result.m_backend.data._M_elems[2] = leavebound.m_backend.data._M_elems[2];
                    result.m_backend.data._M_elems[3] = leavebound.m_backend.data._M_elems[3];
                    result.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
                    result.m_backend.data._M_elems[1] = leavebound.m_backend.data._M_elems[1];
                    result.m_backend.exp = leavebound.m_backend.exp;
                    result.m_backend.neg = leavebound.m_backend.neg;
                    result.m_backend.fpclass = leavebound.m_backend.fpclass;
                    result.m_backend.prec_elem = leavebound.m_backend.prec_elem;
                    pcVar32 = pcVar30;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                            (&result.m_backend,pcVar32);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&(pUVar34->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start
                              [*(int *)((long)(&(pIVar12->data).
                                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                .m_elem[-1].val + 1) + lVar31)].m_backend,
                             &result.m_backend);
                  lVar37 = lVar37 + -1;
                  pSVar35 = local_7b8;
                  lVar31 = lVar31 + -0x3c;
                } while (1 < lVar37);
              }
            }
            bVar24 = 1 < (long)uVar33;
            uVar33 = uVar41;
          } while (bVar24);
        }
        if (local_7b0->info < 1) {
          pUVar34 = pSVar35->thePvec;
          SPxRowId::SPxRowId((SPxRowId *)&result,(SPxId *)local_7b0);
          pLVar19 = &(pSVar35->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        else {
          pUVar34 = pSVar35->theCoPvec;
          SPxColId::SPxColId((SPxColId *)&result,(SPxId *)local_7b0);
          pLVar19 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&(pSVar35->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        iVar25 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                 ::number(&(pLVar19->
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).set,(DataKey *)&result);
        pnVar10 = (pUVar34->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_5f8.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar25].m_backend;
        local_5f8.data._M_elems._8_8_ = *(undefined8 *)(pnVar10[iVar25].m_backend.data._M_elems + 2)
        ;
        puVar1 = pnVar10[iVar25].m_backend.data._M_elems + 4;
        local_5f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar40 = *(undefined8 *)(puVar1 + 2);
        local_5f8.data._M_elems._24_5_ = SUB85(uVar40,0);
        local_5f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar40 >> 0x28);
        uVar40 = *(undefined8 *)(pnVar10[iVar25].m_backend.data._M_elems + 8);
        local_5f8.data._M_elems._32_5_ = SUB85(uVar40,0);
        local_5f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar40 >> 0x28);
        local_5f8.exp = pnVar10[iVar25].m_backend.exp;
        local_5f8.neg = pnVar10[iVar25].m_backend.neg;
        local_5f8.fpclass = pnVar10[iVar25].m_backend.fpclass;
        local_5f8.prec_elem = pnVar10[iVar25].m_backend.prec_elem;
        pSVar35->totalboundflips = pSVar35->totalboundflips + pSVar35->boundflips;
      }
      pnVar10 = (pSVar35->theCoPrhs->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar10[uVar26].m_backend.data._M_elems + 8) =
           CONCAT35(enterRO.m_backend.data._M_elems[9]._1_3_,enterRO.m_backend.data._M_elems._32_5_)
      ;
      puVar1 = pnVar10[uVar26].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = enterRO.m_backend.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(enterRO.m_backend.data._M_elems[7]._1_3_,enterRO.m_backend.data._M_elems._24_5_)
      ;
      *(undefined8 *)&pnVar10[uVar26].m_backend.data = enterRO.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar10[uVar26].m_backend.data._M_elems + 2) =
           enterRO.m_backend.data._M_elems._8_8_;
      pnVar10[uVar26].m_backend.exp = enterRO.m_backend.exp;
      pnVar10[uVar26].m_backend.neg = enterRO.m_backend.neg;
      pnVar10[uVar26].m_backend.fpclass = enterRO.m_backend.fpclass;
      pnVar10[uVar26].m_backend.prec_elem = enterRO.m_backend.prec_elem;
      leavebound.m_backend.data._M_elems[0] = enterRO.m_backend.data._M_elems[0];
      leavebound.m_backend.data._M_elems[1] = enterRO.m_backend.data._M_elems[1];
      leavebound.m_backend.data._M_elems[2] = enterRO.m_backend.data._M_elems[2];
      leavebound.m_backend.data._M_elems[3] = enterRO.m_backend.data._M_elems[3];
      leavebound.m_backend.data._M_elems[4] = enterRO.m_backend.data._M_elems[4];
      leavebound.m_backend.data._M_elems[5] = enterRO.m_backend.data._M_elems[5];
      leavebound.m_backend.data._M_elems[6] = enterRO.m_backend.data._M_elems[6];
      leavebound.m_backend.data._M_elems[7] =
           (uint)(CONCAT35(enterRO.m_backend.data._M_elems[7]._1_3_,
                           enterRO.m_backend.data._M_elems._24_5_) >> 0x20);
      leavebound.m_backend.data._M_elems._32_5_ = enterRO.m_backend.data._M_elems._32_5_;
      leavebound.m_backend.data._M_elems[9]._1_3_ = enterRO.m_backend.data._M_elems[9]._1_3_;
      leavebound.m_backend.exp = enterRO.m_backend.exp;
      leavebound.m_backend.neg = enterRO.m_backend.neg;
      leavebound.m_backend.fpclass = enterRO.m_backend.fpclass;
      leavebound.m_backend.prec_elem = enterRO.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&leavebound.m_backend,&local_5f8);
      pnVar10 = (pSVar35->theFvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar40 = *(undefined8 *)(pnVar10[uVar26].m_backend.data._M_elems + 8);
      result_11.m_backend.data._M_elems._32_5_ = SUB85(uVar40,0);
      result_11.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar40 >> 0x28);
      result_11.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[uVar26].m_backend.data;
      result_11.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar10[uVar26].m_backend.data._M_elems + 2);
      puVar1 = pnVar10[uVar26].m_backend.data._M_elems + 4;
      result_11.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar40 = *(undefined8 *)(puVar1 + 2);
      result_11.m_backend.data._M_elems[6] = (uint)uVar40;
      result_11.m_backend.data._M_elems[7] = (uint)((ulong)uVar40 >> 0x20);
      result_11.m_backend.exp = pnVar10[uVar26].m_backend.exp;
      result_11.m_backend.neg = pnVar10[uVar26].m_backend.neg;
      result_11.m_backend.fpclass = pnVar10[uVar26].m_backend.fpclass;
      result_11.m_backend.prec_elem = pnVar10[uVar26].m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&leavebound.m_backend,&result_11.m_backend);
      pUVar34 = pSVar35->theCoPvec;
      *(ulong *)((pUVar34->theval).m_backend.data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(ulong *)((pUVar34->theval).m_backend.data._M_elems + 4) =
           CONCAT44(result.m_backend.data._M_elems[5],result.m_backend.data._M_elems[4]);
      *(ulong *)((pUVar34->theval).m_backend.data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(pUVar34->theval).m_backend.data._M_elems =
           result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((pUVar34->theval).m_backend.data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (pUVar34->theval).m_backend.exp = result.m_backend.exp;
      (pUVar34->theval).m_backend.neg = result.m_backend.neg;
      (pUVar34->theval).m_backend.fpclass = result.m_backend.fpclass;
      (pUVar34->theval).m_backend.prec_elem = result.m_backend.prec_elem;
      pUVar34 = pSVar35->theCoPvec;
      RVar42 = Tolerances::epsilon((pSVar35->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result,RVar42);
      if ((((pUVar34->theval).m_backend.fpclass == cpp_dec_float_NaN) ||
          (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&(pUVar34->theval).m_backend,&result.m_backend), pSVar35 = local_7b8,
         iVar25 < 1)) {
        pSVar35 = local_7b8;
        pUVar34 = local_7b8->theCoPvec;
        RVar42 = Tolerances::epsilon((local_7b8->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        result_11.m_backend.fpclass = cpp_dec_float_finite;
        result_11.m_backend.prec_elem = 10;
        result_11.m_backend.data._M_elems[0] = 0;
        result_11.m_backend.data._M_elems[1] = 0;
        result_11.m_backend.data._M_elems[2] = 0;
        result_11.m_backend.data._M_elems[3] = 0;
        result_11.m_backend.data._M_elems[4] = 0;
        result_11.m_backend.data._M_elems[5] = 0;
        result_11.m_backend.data._M_elems[6] = 0;
        result_11.m_backend.data._M_elems[7] = 0;
        result_11.m_backend.data._M_elems._32_5_ = 0;
        result_11.m_backend.data._M_elems[9]._1_3_ = 0;
        result_11.m_backend.exp = 0;
        result_11.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&result_11,RVar42);
        leavebound.m_backend.data._M_elems[0] = result_11.m_backend.data._M_elems[0];
        leavebound.m_backend.data._M_elems[1] = result_11.m_backend.data._M_elems[1];
        uVar40 = leavebound.m_backend.data._M_elems._0_8_;
        leavebound.m_backend.data._M_elems[2] = result_11.m_backend.data._M_elems[2];
        leavebound.m_backend.data._M_elems[3] = result_11.m_backend.data._M_elems[3];
        leavebound.m_backend.data._M_elems[4] = result_11.m_backend.data._M_elems[4];
        leavebound.m_backend.data._M_elems[5] = result_11.m_backend.data._M_elems[5];
        leavebound.m_backend.data._M_elems[6] = result_11.m_backend.data._M_elems[6];
        leavebound.m_backend.data._M_elems[7] = result_11.m_backend.data._M_elems[7];
        leavebound.m_backend.data._M_elems._32_5_ = result_11.m_backend.data._M_elems._32_5_;
        leavebound.m_backend.data._M_elems[9]._1_3_ = result_11.m_backend.data._M_elems[9]._1_3_;
        leavebound.m_backend.exp = result_11.m_backend.exp;
        leavebound.m_backend.neg = result_11.m_backend.neg;
        leavebound.m_backend.fpclass = result_11.m_backend.fpclass;
        leavebound.m_backend.prec_elem = result_11.m_backend.prec_elem;
        leavebound.m_backend.data._M_elems[0] = result_11.m_backend.data._M_elems[0];
        if (leavebound.m_backend.data._M_elems[0] != 0 ||
            result_11.m_backend.fpclass != cpp_dec_float_finite) {
          leavebound.m_backend.neg = (bool)(result_11.m_backend.neg ^ 1);
        }
        if (((result_11.m_backend.fpclass != cpp_dec_float_NaN) &&
            ((pUVar34->theval).m_backend.fpclass != cpp_dec_float_NaN)) &&
           (leavebound.m_backend.data._M_elems._0_8_ = uVar40,
           iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&(pUVar34->theval).m_backend,&leavebound.m_backend), iVar25 < 0))
        goto LAB_002832d3;
      }
      else {
LAB_002832d3:
        if (pSVar35->thePricing == FULL) {
          pUVar34 = pSVar35->theCoPvec;
          pUVar13 = pSVar35->thePvec;
          *(undefined8 *)((pUVar13->theval).m_backend.data._M_elems + 8) =
               *(undefined8 *)((pUVar34->theval).m_backend.data._M_elems + 8);
          uVar40 = *(undefined8 *)(pUVar34->theval).m_backend.data._M_elems;
          uVar18 = *(undefined8 *)((pUVar34->theval).m_backend.data._M_elems + 2);
          uVar38 = (pUVar34->theval).m_backend.data._M_elems[5];
          uVar16 = (pUVar34->theval).m_backend.data._M_elems[6];
          uVar17 = (pUVar34->theval).m_backend.data._M_elems[7];
          (pUVar13->theval).m_backend.data._M_elems[4] =
               (pUVar34->theval).m_backend.data._M_elems[4];
          (pUVar13->theval).m_backend.data._M_elems[5] = uVar38;
          (pUVar13->theval).m_backend.data._M_elems[6] = uVar16;
          (pUVar13->theval).m_backend.data._M_elems[7] = uVar17;
          *(undefined8 *)(pUVar13->theval).m_backend.data._M_elems = uVar40;
          *(undefined8 *)((pUVar13->theval).m_backend.data._M_elems + 2) = uVar18;
          (pUVar13->theval).m_backend.exp = (pUVar34->theval).m_backend.exp;
          (pUVar13->theval).m_backend.neg = (pUVar34->theval).m_backend.neg;
          iVar20 = (pUVar34->theval).m_backend.prec_elem;
          (pUVar13->theval).m_backend.fpclass = (pUVar34->theval).m_backend.fpclass;
          (pUVar13->theval).m_backend.prec_elem = iVar20;
          (*(pSVar35->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x86])(pSVar35);
        }
        (*(pSVar35->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x87])(pSVar35);
      }
      leavebound.m_backend.fpclass = cpp_dec_float_finite;
      leavebound.m_backend.prec_elem = 10;
      leavebound.m_backend.data._M_elems[0] = 0;
      leavebound.m_backend.data._M_elems[1] = 0;
      leavebound.m_backend.data._M_elems[2] = 0;
      leavebound.m_backend.data._M_elems[3] = 0;
      leavebound.m_backend.data._M_elems[4] = 0;
      leavebound.m_backend.data._M_elems[5] = 0;
      leavebound.m_backend.data._M_elems[6] = 0;
      leavebound.m_backend.data._M_elems[7] = 0;
      leavebound.m_backend.data._M_elems._32_5_ = 0;
      leavebound.m_backend.data._M_elems[9]._1_3_ = 0;
      leavebound.m_backend.exp = 0;
      leavebound.m_backend.neg = false;
      local_168[0] = enterMax.m_backend.data._M_elems[0];
      local_168[1] = enterMax.m_backend.data._M_elems[1];
      auStack_160[0] = enterMax.m_backend.data._M_elems[2];
      auStack_160[1] = enterMax.m_backend.data._M_elems[3];
      local_158 = enterMax.m_backend.data._M_elems[4];
      uStack_154 = enterMax.m_backend.data._M_elems[5];
      uStack_150 = enterMax.m_backend.data._M_elems[6];
      uStack_14c = enterMax.m_backend.data._M_elems[7];
      local_148 = CONCAT35(enterMax.m_backend.data._M_elems[9]._1_3_,
                           enterMax.m_backend.data._M_elems._32_5_);
      local_140 = enterMax.m_backend.exp;
      local_13c = enterMax.m_backend.neg;
      local_138 = enterMax.m_backend.fpclass;
      iStack_134 = enterMax.m_backend.prec_elem;
      (*(pSVar35->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x82])(pSVar35,(ulong)uVar26,local_168,&leavebound,local_518);
      pnVar10 = (pSVar35->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar10[uVar26].m_backend.data._M_elems + 8) =
           CONCAT35(enterUB.m_backend.data._M_elems[9]._1_3_,enterUB.m_backend.data._M_elems._32_5_)
      ;
      puVar1 = pnVar10[uVar26].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = enterUB.m_backend.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(enterUB.m_backend.data._M_elems[7]._1_3_,enterUB.m_backend.data._M_elems._24_5_)
      ;
      *(undefined8 *)&pnVar10[uVar26].m_backend.data = enterUB.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar10[uVar26].m_backend.data._M_elems + 2) =
           enterUB.m_backend.data._M_elems._8_8_;
      pnVar10[uVar26].m_backend.exp = enterUB.m_backend.exp;
      pnVar10[uVar26].m_backend.neg = enterUB.m_backend.neg;
      pnVar10[uVar26].m_backend.fpclass = enterUB.m_backend.fpclass;
      pnVar10[uVar26].m_backend.prec_elem = enterUB.m_backend.prec_elem;
      pnVar10 = (pSVar35->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar10[uVar26].m_backend.data._M_elems + 8) =
           CONCAT35(enterLB.m_backend.data._M_elems[9]._1_3_,enterLB.m_backend.data._M_elems._32_5_)
      ;
      puVar1 = pnVar10[uVar26].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = enterLB.m_backend.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(enterLB.m_backend.data._M_elems[7]._1_3_,enterLB.m_backend.data._M_elems._24_5_)
      ;
      *(undefined8 *)&pnVar10[uVar26].m_backend.data = enterLB.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar10[uVar26].m_backend.data._M_elems + 2) =
           enterLB.m_backend.data._M_elems._8_8_;
      pnVar10[uVar26].m_backend.exp = enterLB.m_backend.exp;
      pnVar10[uVar26].m_backend.neg = enterLB.m_backend.neg;
      pnVar10[uVar26].m_backend.fpclass = enterLB.m_backend.fpclass;
      pnVar10[uVar26].m_backend.prec_elem = enterLB.m_backend.prec_elem;
      updateCoTest(pSVar35);
      if (pSVar35->thePricing == FULL) {
        updateTest(pSVar35);
      }
      pUVar34 = pSVar35->theFvec;
      *(ulong *)((pUVar34->theval).m_backend.data._M_elems + 8) =
           CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                    result_1.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((pUVar34->theval).m_backend.data._M_elems + 4) =
           result_1.m_backend.data._M_elems._16_8_;
      *(ulong *)((pUVar34->theval).m_backend.data._M_elems + 6) =
           CONCAT44(result_1.m_backend.data._M_elems[7],result_1.m_backend.data._M_elems[6]);
      *(undefined8 *)(pUVar34->theval).m_backend.data._M_elems =
           result_1.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((pUVar34->theval).m_backend.data._M_elems + 2) =
           result_1.m_backend.data._M_elems._8_8_;
      (pUVar34->theval).m_backend.exp = result_1.m_backend.exp;
      (pUVar34->theval).m_backend.neg = result_1.m_backend.neg;
      (pUVar34->theval).m_backend.fpclass = result_1.m_backend.fpclass;
      (pUVar34->theval).m_backend.prec_elem = result_1.m_backend.prec_elem;
      pUVar34 = local_7b8->theFvec;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::
      multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)pUVar34,&pUVar34->theval,&pUVar34->thedelta);
      pSVar35 = local_7b8;
      result.m_backend.data._M_elems[0] = enterVal.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = enterVal.m_backend.data._M_elems[1];
      result.m_backend.data._M_elems[2] = enterVal.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = enterVal.m_backend.data._M_elems[3];
      result.m_backend.data._M_elems[4] = enterVal.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = enterVal.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems[6] = enterVal.m_backend.data._M_elems[6];
      result.m_backend.data._M_elems[7] =
           (uint)(CONCAT35(enterVal.m_backend.data._M_elems[7]._1_3_,
                           enterVal.m_backend.data._M_elems._24_5_) >> 0x20);
      result.m_backend.data._M_elems._32_5_ = enterVal.m_backend.data._M_elems._32_5_;
      result.m_backend.data._M_elems[9]._1_3_ = enterVal.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.exp = enterVal.m_backend.exp;
      result.m_backend.neg = enterVal.m_backend.neg;
      result.m_backend.fpclass = enterVal.m_backend.fpclass;
      result.m_backend.prec_elem = enterVal.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&result.m_backend,&result_1.m_backend);
      pnVar10 = (pSVar35->theFvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar10[uVar26].m_backend.data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      puVar1 = pnVar10[uVar26].m_backend.data._M_elems + 4;
      *(ulong *)puVar1 =
           CONCAT44(result.m_backend.data._M_elems[5],result.m_backend.data._M_elems[4]);
      *(ulong *)(puVar1 + 2) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)&pnVar10[uVar26].m_backend = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar10[uVar26].m_backend.data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      pnVar10[uVar26].m_backend.exp = result.m_backend.exp;
      pnVar10[uVar26].m_backend.neg = result.m_backend.neg;
      pnVar10[uVar26].m_backend.fpclass = result.m_backend.fpclass;
      pnVar10[uVar26].m_backend.prec_elem = result.m_backend.prec_elem;
      RVar42 = Tolerances::epsilon((pSVar35->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result,RVar42);
      if (((leavebound.m_backend.fpclass == cpp_dec_float_NaN) ||
          (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&leavebound.m_backend,&result.m_backend), iVar25 < 1)) {
        RVar42 = Tolerances::epsilon((pSVar35->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        local_3b8._0_4_ = cpp_dec_float_finite;
        local_3b8._4_4_ = 10;
        local_3e8._0_4_ = 0;
        local_3e8._4_4_ = 0;
        auStack_3e0[0] = 0;
        auStack_3e0[1] = 0;
        auStack_3e0[2] = 0;
        auStack_3e0[3] = 0;
        uStack_3d0 = 0;
        uStack_3cb = 0;
        _local_3c8 = 0;
        uStack_3c3 = 0;
        local_3c0 = 0;
        local_3bc = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,RVar42);
        result_11.m_backend.data._M_elems[0] = (uint)local_3e8;
        result_11.m_backend.data._M_elems[1] = local_3e8._4_4_;
        uVar40 = result_11.m_backend.data._M_elems._0_8_;
        result_11.m_backend.data._M_elems[2] = auStack_3e0[0];
        result_11.m_backend.data._M_elems[3] = auStack_3e0[1];
        result_11.m_backend.data._M_elems[4] = auStack_3e0[2];
        result_11.m_backend.data._M_elems[5] = auStack_3e0[3];
        result_11.m_backend.data._M_elems[6] = (uint)uStack_3d0;
        result_11.m_backend.data._M_elems[7] = (uint)(CONCAT35(uStack_3cb,uStack_3d0) >> 0x20);
        result_11.m_backend.data._M_elems._32_5_ = _local_3c8;
        result_11.m_backend.data._M_elems[9]._1_3_ = uStack_3c3;
        result_11.m_backend.exp = local_3c0;
        result_11.m_backend.neg = (bool)local_3bc;
        result_11.m_backend.fpclass = (fpclass_type)local_3b8;
        result_11.m_backend.prec_elem = local_3b8._4_4_;
        result_11.m_backend.data._M_elems[0] = (uint)local_3e8;
        if (result_11.m_backend.data._M_elems[0] != 0 ||
            (fpclass_type)local_3b8 != cpp_dec_float_finite) {
          result_11.m_backend.neg = (bool)(local_3bc ^ 1);
        }
        result_11.m_backend.data._M_elems._0_8_ = uVar40;
        if ((((fpclass_type)local_3b8 != cpp_dec_float_NaN) &&
            (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&leavebound.m_backend,&result_11.m_backend), iVar25 < 0))
        goto LAB_00283688;
      }
      else {
LAB_00283688:
        pVVar14 = pSVar35->theFrhs;
        result_11.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
        result_11.m_backend.data._M_elems[1] = leavebound.m_backend.data._M_elems[1];
        uVar40 = result_11.m_backend.data._M_elems._0_8_;
        result_11.m_backend.data._M_elems[2] = leavebound.m_backend.data._M_elems[2];
        result_11.m_backend.data._M_elems[3] = leavebound.m_backend.data._M_elems[3];
        result_11.m_backend.data._M_elems._32_5_ = leavebound.m_backend.data._M_elems._32_5_;
        result_11.m_backend.data._M_elems[9]._1_3_ = leavebound.m_backend.data._M_elems[9]._1_3_;
        result_11.m_backend.data._M_elems[4] = leavebound.m_backend.data._M_elems[4];
        result_11.m_backend.data._M_elems[5] = leavebound.m_backend.data._M_elems[5];
        result_11.m_backend.data._M_elems[6] = leavebound.m_backend.data._M_elems[6];
        result_11.m_backend.data._M_elems[7] = leavebound.m_backend.data._M_elems[7];
        result_11.m_backend.exp = leavebound.m_backend.exp;
        result_11.m_backend.neg = leavebound.m_backend.neg;
        result_11.m_backend.fpclass = leavebound.m_backend.fpclass;
        result_11.m_backend.prec_elem = leavebound.m_backend.prec_elem;
        result_11.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
        if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
            result_11.m_backend.data._M_elems[0] != 0) {
          result_11.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
        }
        pSVar15 = (pSVar35->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).matrix.data[uVar26];
        lVar31 = (long)pSVar15->memused;
        pSVar35 = local_7b8;
        result_11.m_backend.data._M_elems._0_8_ = uVar40;
        if (0 < lVar31) {
          lVar37 = lVar31 + 1;
          lVar31 = lVar31 * 0x3c;
          do {
            pcVar30 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)pSVar15->m_elem[-1].val.m_backend.data._M_elems + lVar31);
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            pcVar32 = &result_11.m_backend;
            if (pcVar30 != &result.m_backend) {
              result.m_backend.data._M_elems._32_5_ = result_11.m_backend.data._M_elems._32_5_;
              result.m_backend.data._M_elems[9]._1_3_ = result_11.m_backend.data._M_elems[9]._1_3_;
              result.m_backend.data._M_elems[4] = result_11.m_backend.data._M_elems[4];
              result.m_backend.data._M_elems[5] = result_11.m_backend.data._M_elems[5];
              result.m_backend.data._M_elems[6] = result_11.m_backend.data._M_elems[6];
              result.m_backend.data._M_elems[7] = result_11.m_backend.data._M_elems[7];
              result.m_backend.data._M_elems[2] = result_11.m_backend.data._M_elems[2];
              result.m_backend.data._M_elems[3] = result_11.m_backend.data._M_elems[3];
              result.m_backend.data._M_elems[0] = result_11.m_backend.data._M_elems[0];
              result.m_backend.data._M_elems[1] = result_11.m_backend.data._M_elems[1];
              result.m_backend.exp = result_11.m_backend.exp;
              result.m_backend.neg = result_11.m_backend.neg;
              result.m_backend.fpclass = result_11.m_backend.fpclass;
              result.m_backend.prec_elem = result_11.m_backend.prec_elem;
              pcVar32 = pcVar30;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&result.m_backend,pcVar32);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&(pVVar14->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [*(int *)((long)(&pSVar15->m_elem[-1].val + 1) + lVar31)].m_backend,
                       &result.m_backend);
            lVar37 = lVar37 + -1;
            pSVar35 = local_7b8;
            lVar31 = lVar31 + -0x3c;
          } while (1 < lVar37);
        }
      }
      RVar42 = Tolerances::epsilon((pSVar35->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result,RVar42);
      if (((enterVal.m_backend.fpclass == cpp_dec_float_NaN) ||
          (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&enterVal.m_backend,&result.m_backend), iVar25 < 1)) {
        RVar42 = Tolerances::epsilon((pSVar35->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        local_3b8._0_4_ = cpp_dec_float_finite;
        local_3b8._4_4_ = 10;
        local_3e8._0_4_ = 0;
        local_3e8._4_4_ = 0;
        auStack_3e0[0] = 0;
        auStack_3e0[1] = 0;
        auStack_3e0[2] = 0;
        auStack_3e0[3] = 0;
        uStack_3d0 = 0;
        uStack_3cb = 0;
        _local_3c8 = 0;
        uStack_3c3 = 0;
        local_3c0 = 0;
        local_3bc = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,RVar42);
        result_11.m_backend.data._M_elems[0] = (uint)local_3e8;
        result_11.m_backend.data._M_elems[1] = local_3e8._4_4_;
        uVar40 = result_11.m_backend.data._M_elems._0_8_;
        result_11.m_backend.data._M_elems[2] = auStack_3e0[0];
        result_11.m_backend.data._M_elems[3] = auStack_3e0[1];
        result_11.m_backend.data._M_elems[4] = auStack_3e0[2];
        result_11.m_backend.data._M_elems[5] = auStack_3e0[3];
        result_11.m_backend.data._M_elems[6] = (uint)uStack_3d0;
        result_11.m_backend.data._M_elems[7] = (uint)(CONCAT35(uStack_3cb,uStack_3d0) >> 0x20);
        result_11.m_backend.data._M_elems._32_5_ = _local_3c8;
        result_11.m_backend.data._M_elems[9]._1_3_ = uStack_3c3;
        result_11.m_backend.exp = local_3c0;
        result_11.m_backend.neg = (bool)local_3bc;
        result_11.m_backend.fpclass = (fpclass_type)local_3b8;
        result_11.m_backend.prec_elem = local_3b8._4_4_;
        result_11.m_backend.data._M_elems[0] = (uint)local_3e8;
        if (result_11.m_backend.data._M_elems[0] != 0 ||
            (fpclass_type)local_3b8 != cpp_dec_float_finite) {
          result_11.m_backend.neg = (bool)(local_3bc ^ 1);
        }
        result_11.m_backend.data._M_elems._0_8_ = uVar40;
        if ((((fpclass_type)local_3b8 != cpp_dec_float_NaN) &&
            (enterVal.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&enterVal.m_backend,&result_11.m_backend), iVar25 < 0))
        goto LAB_00283909;
      }
      else {
LAB_00283909:
        lVar31 = (long)rhs->memused;
        if (0 < lVar31) {
          pVVar14 = pSVar35->theFrhs;
          lVar37 = lVar31 + 1;
          lVar31 = lVar31 * 0x3c;
          do {
            pcVar30 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)rhs->m_elem[-1].val.m_backend.data._M_elems + lVar31);
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            pcVar32 = &enterVal.m_backend;
            if (pcVar30 != &result.m_backend) {
              result.m_backend.data._M_elems._32_5_ = enterVal.m_backend.data._M_elems._32_5_;
              result.m_backend.data._M_elems[9]._1_3_ = enterVal.m_backend.data._M_elems[9]._1_3_;
              result.m_backend.data._M_elems[4] = enterVal.m_backend.data._M_elems[4];
              result.m_backend.data._M_elems[5] = enterVal.m_backend.data._M_elems[5];
              result.m_backend.data._M_elems[6] = enterVal.m_backend.data._M_elems[6];
              result.m_backend.data._M_elems[7] =
                   (uint)(CONCAT35(enterVal.m_backend.data._M_elems[7]._1_3_,
                                   enterVal.m_backend.data._M_elems._24_5_) >> 0x20);
              result.m_backend.data._M_elems[2] = enterVal.m_backend.data._M_elems[2];
              result.m_backend.data._M_elems[3] = enterVal.m_backend.data._M_elems[3];
              result.m_backend.data._M_elems[0] = enterVal.m_backend.data._M_elems[0];
              result.m_backend.data._M_elems[1] = enterVal.m_backend.data._M_elems[1];
              result.m_backend.exp = enterVal.m_backend.exp;
              result.m_backend.neg = enterVal.m_backend.neg;
              result.m_backend.fpclass = enterVal.m_backend.fpclass;
              result.m_backend.prec_elem = enterVal.m_backend.prec_elem;
              pcVar32 = pcVar30;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&result.m_backend,pcVar32);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&(pVVar14->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [*(int *)((long)(&rhs->m_elem[-1].val + 1) + lVar31)].m_backend,
                       &result.m_backend);
            lVar37 = lVar37 + -1;
            lVar31 = lVar31 + -0x3c;
          } while (1 < lVar37);
        }
      }
      local_1e8[0].m_backend.data._M_elems[9]._1_3_ = uStack_4f3;
      local_1e8[0].m_backend.data._M_elems._32_5_ = local_4f8;
      local_1e8[0].m_backend.data._M_elems[7]._1_3_ = uStack_4fb;
      local_1e8[0].m_backend.data._M_elems._24_5_ = uStack_500;
      local_1e8[0].m_backend.data._M_elems[4] = local_518[4];
      local_1e8[0].m_backend.data._M_elems[5] = local_518[5];
      local_1e8[0].m_backend.data._M_elems[0] = local_518[0];
      local_1e8[0].m_backend.data._M_elems[1] = local_518[1];
      local_1e8[0].m_backend.data._M_elems[2] = local_518[2];
      local_1e8[0].m_backend.data._M_elems[3] = local_518[3];
      local_1e8[0].m_backend.exp = local_4f0;
      local_1e8[0].m_backend.neg = (bool)local_4ec;
      local_1e8[0].m_backend.fpclass = (fpclass_type)local_4e8;
      local_1e8[0].m_backend.prec_elem = local_4e8._4_4_;
      updateNonbasicValue(pSVar35,local_1e8);
      (**(pSVar35->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)
                (&pSVar35->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,(ulong)uVar26,local_7b0,rhs,&pSVar35->theFvec->thedelta);
      uVar40 = local_5c0;
      goto LAB_00283a60;
    }
    local_428.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
    local_428.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
    local_428.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
    local_428.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
    local_428.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    local_428.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    local_428.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    local_428.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    local_428.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    local_428.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    local_428.m_backend.exp = result_1.m_backend.exp;
    local_428.m_backend.neg = result_1.m_backend.neg;
    local_428.m_backend.fpclass = result_1.m_backend.fpclass;
    local_428.m_backend.prec_elem = result_1.m_backend.prec_elem;
    result_16.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
    result_16.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
    result_16.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result_16.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
    uVar18 = result_16.m_backend.data._M_elems._0_8_;
    result_16.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
    result_16.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
    result_16.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
    result_16.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
    result_16.m_backend.data._M_elems[9]._1_3_ = enterMax.m_backend.data._M_elems[9]._1_3_;
    result_16.m_backend.data._M_elems._32_5_ = enterMax.m_backend.data._M_elems._32_5_;
    result_16.m_backend.exp = enterMax.m_backend.exp;
    result_16.m_backend.neg = enterMax.m_backend.neg;
    result_16.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_16.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    result_16.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
        result_16.m_backend.data._M_elems[0] != 0) {
      result_16.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    result_16.m_backend.data._M_elems._0_8_ = uVar18;
    RVar42 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar23 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_428,&result_16,RVar42);
    if (!bVar23) {
      if (!polish) {
        ::soplex::infinity::__tls_init();
        pdVar27 = (double *)__tls_get_addr(&PTR_003b6b60);
        a = *pdVar27;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&result,a);
        if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_1.m_backend,&result.m_backend), iVar25 < 0)) {
          ::soplex::infinity::__tls_init();
          leavebound.m_backend.fpclass = cpp_dec_float_finite;
          leavebound.m_backend.prec_elem = 10;
          leavebound.m_backend.data._M_elems[0] = 0;
          leavebound.m_backend.data._M_elems[1] = 0;
          leavebound.m_backend.data._M_elems[2] = 0;
          leavebound.m_backend.data._M_elems[3] = 0;
          leavebound.m_backend.data._M_elems[4] = 0;
          leavebound.m_backend.data._M_elems[5] = 0;
          leavebound.m_backend.data._M_elems[6] = 0;
          leavebound.m_backend.data._M_elems[7] = 0;
          leavebound.m_backend.data._M_elems._32_5_ = 0;
          leavebound.m_backend.data._M_elems[9]._1_3_ = 0;
          leavebound.m_backend.exp = 0;
          leavebound.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&leavebound,-a);
          if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
              (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&result_1.m_backend,&leavebound.m_backend), pDVar22 = local_7b0,
             0 < iVar25)) {
            (**(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase)
                      (&this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,0xffffffff,local_7b0,rhs,0);
            pUVar34 = this->theFvec;
            *(ulong *)((pUVar34->theval).m_backend.data._M_elems + 8) =
                 CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                          result_1.m_backend.data._M_elems._32_5_);
            *(undefined8 *)((pUVar34->theval).m_backend.data._M_elems + 4) =
                 result_1.m_backend.data._M_elems._16_8_;
            *(ulong *)((pUVar34->theval).m_backend.data._M_elems + 6) =
                 CONCAT44(result_1.m_backend.data._M_elems[7],result_1.m_backend.data._M_elems[6]);
            *(undefined8 *)(pUVar34->theval).m_backend.data._M_elems =
                 result_1.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((pUVar34->theval).m_backend.data._M_elems + 2) =
                 result_1.m_backend.data._M_elems._8_8_;
            (pUVar34->theval).m_backend.exp = result_1.m_backend.exp;
            (pUVar34->theval).m_backend.neg = result_1.m_backend.neg;
            (pUVar34->theval).m_backend.fpclass = result_1.m_backend.fpclass;
            (pUVar34->theval).m_backend.prec_elem = result_1.m_backend.prec_elem;
            pUVar34 = this->theFvec;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)pUVar34,&pUVar34->theval,&pUVar34->thedelta);
            local_288 = CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                                 result_1.m_backend.data._M_elems._32_5_);
            local_298 = result_1.m_backend.data._M_elems[4];
            uStack_294 = result_1.m_backend.data._M_elems[5];
            uStack_290 = result_1.m_backend.data._M_elems[6];
            uStack_28c = result_1.m_backend.data._M_elems[7];
            local_2a8[0] = result_1.m_backend.data._M_elems[0];
            local_2a8[1] = result_1.m_backend.data._M_elems[1];
            auStack_2a0[0] = result_1.m_backend.data._M_elems[2];
            auStack_2a0[1] = result_1.m_backend.data._M_elems[3];
            local_280 = result_1.m_backend.exp;
            local_27c = result_1.m_backend.neg;
            local_278 = result_1.m_backend.fpclass;
            iStack_274 = result_1.m_backend.prec_elem;
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x83])(this,*pDVar22,(ulong)(uint)enterStat,local_2a8,rhs,local_518)
            ;
            local_2e8.m_backend.data._M_elems[9]._1_3_ = uStack_4f3;
            local_2e8.m_backend.data._M_elems._32_5_ = local_4f8;
            local_2e8.m_backend.data._M_elems[7]._1_3_ = uStack_4fb;
            local_2e8.m_backend.data._M_elems._24_5_ = uStack_500;
            local_2e8.m_backend.data._M_elems[4] = local_518[4];
            local_2e8.m_backend.data._M_elems[5] = local_518[5];
            local_2e8.m_backend.data._M_elems[0] = local_518[0];
            local_2e8.m_backend.data._M_elems[1] = local_518[1];
            local_2e8.m_backend.data._M_elems[2] = local_518[2];
            local_2e8.m_backend.data._M_elems[3] = local_518[3];
            local_2e8.m_backend.exp = local_4f0;
            local_2e8.m_backend.neg = (bool)local_4ec;
            local_2e8.m_backend.fpclass = (fpclass_type)local_4e8;
            local_2e8.m_backend.prec_elem = local_4e8._4_4_;
            updateNonbasicValue(this,&local_2e8);
            goto LAB_00283a60;
          }
        }
      }
      local_308 = CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                           enterTest.m_backend.data._M_elems._32_5_);
      local_318 = enterTest.m_backend.data._M_elems[4];
      uStack_314 = enterTest.m_backend.data._M_elems[5];
      uStack_310 = enterTest.m_backend.data._M_elems[6];
      uStack_30c = enterTest.m_backend.data._M_elems[7];
      local_328[0] = enterTest.m_backend.data._M_elems[0];
      local_328[1] = enterTest.m_backend.data._M_elems[1];
      auStack_320[0] = enterTest.m_backend.data._M_elems[2];
      auStack_320[1] = enterTest.m_backend.data._M_elems[3];
      local_300 = enterTest.m_backend.exp;
      local_2fc = enterTest.m_backend.neg;
      local_2f8 = enterTest.m_backend.fpclass;
      iStack_2f4 = enterTest.m_backend.prec_elem;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(this,*local_7b0,local_328,(ulong)(uint)enterStat);
      (**(this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)
                (&this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffff,&none,0,0);
      if (!polish) {
        if ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).updateCount < 2) {
          result.m_backend.data._M_elems._32_5_ = enterTest.m_backend.data._M_elems._32_5_;
          result.m_backend.data._M_elems[9]._1_3_ = enterTest.m_backend.data._M_elems[9]._1_3_;
          result.m_backend.data._M_elems[4] = enterTest.m_backend.data._M_elems[4];
          result.m_backend.data._M_elems[5] = enterTest.m_backend.data._M_elems[5];
          result.m_backend.data._M_elems[6] = enterTest.m_backend.data._M_elems[6];
          result.m_backend.data._M_elems[7] = enterTest.m_backend.data._M_elems[7];
          result.m_backend.data._M_elems[2] = enterTest.m_backend.data._M_elems[2];
          result.m_backend.data._M_elems[3] = enterTest.m_backend.data._M_elems[3];
          result.m_backend.data._M_elems[0] = enterTest.m_backend.data._M_elems[0];
          result.m_backend.data._M_elems[1] = enterTest.m_backend.data._M_elems[1];
          auVar21 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
          result.m_backend.exp = enterTest.m_backend.exp;
          result.m_backend.neg = enterTest.m_backend.neg;
          result.m_backend.fpclass = enterTest.m_backend.fpclass;
          result.m_backend.prec_elem = enterTest.m_backend.prec_elem;
          if ((enterTest.m_backend.neg == true) &&
             (result.m_backend.data._M_elems[0] = enterTest.m_backend.data._M_elems[0],
             enterTest.m_backend.fpclass != cpp_dec_float_finite ||
             result.m_backend.data._M_elems[0] != 0)) {
            result.m_backend.neg = false;
          }
          result.m_backend.data._M_elems._0_16_ = auVar21;
          entertol(&leavebound,this);
          if (((result.m_backend.fpclass == cpp_dec_float_NaN) ||
              (leavebound.m_backend.fpclass == cpp_dec_float_NaN)) ||
             (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&result.m_backend,&leavebound.m_backend), -1 < iVar25)) {
            pSVar28 = this->spxout;
            if ((pSVar28 != (SPxOut *)0x0) && (4 < (int)pSVar28->m_verbosity)) {
              result.m_backend.data._M_elems[0] = pSVar28->m_verbosity;
              leavebound.m_backend.data._M_elems[0] = 5;
              (*pSVar28->_vptr_SPxOut[2])();
              pSVar28 = operator<<(this->spxout,"IENTER02 unboundedness/infeasibility found in ");
              pSVar28 = operator<<(pSVar28,"enter()");
              std::endl<char,std::char_traits<char>>(pSVar28->m_streams[pSVar28->m_verbosity]);
              (*this->spxout->_vptr_SPxOut[2])(this->spxout,&result);
            }
            if (this->theRep == ROW) {
              local_368.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_
              ;
              local_368.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
              local_368.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
              local_368.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
              local_368.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              local_368.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              local_368.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              local_368.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              local_368.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              local_368.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              local_368.m_backend.exp = result_1.m_backend.exp;
              local_368.m_backend.neg = result_1.m_backend.neg;
              local_368.m_backend.fpclass = result_1.m_backend.fpclass;
              local_368.m_backend.prec_elem = result_1.m_backend.prec_elem;
              computeDualfarkas4Row(this,&local_368,(SPxId)*local_7b0);
              if (this->m_status == OPTIMAL) {
                this->m_status = UNKNOWN;
              }
              if ((this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thestatus != INFEASIBLE) {
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thestatus = INFEASIBLE;
              }
            }
            else {
              local_3a8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_
              ;
              local_3a8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
              local_3a8.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
              local_3a8.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
              local_3a8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              local_3a8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              local_3a8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              local_3a8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              local_3a8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              local_3a8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              local_3a8.m_backend.exp = result_1.m_backend.exp;
              local_3a8.m_backend.neg = result_1.m_backend.neg;
              local_3a8.m_backend.fpclass = result_1.m_backend.fpclass;
              local_3a8.m_backend.prec_elem = result_1.m_backend.prec_elem;
              computePrimalray4Col(this,&local_3a8,(SPxId)*local_7b0);
              if (this->m_status == OPTIMAL) {
                this->m_status = UNKNOWN;
              }
              if ((this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thestatus != UNBOUNDED) {
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thestatus = UNBOUNDED;
              }
            }
          }
          else {
            pSVar28 = this->spxout;
            if ((pSVar28 != (SPxOut *)0x0) && (4 < (int)pSVar28->m_verbosity)) {
              result.m_backend.data._M_elems[0] = pSVar28->m_verbosity;
              leavebound.m_backend.data._M_elems[0] = 5;
              (*pSVar28->_vptr_SPxOut[2])();
              pSVar28 = operator<<(this->spxout,"IENTER11 clean up step to reduce numerical errors")
              ;
              std::endl<char,std::char_traits<char>>(pSVar28->m_streams[pSVar28->m_verbosity]);
              (*this->spxout->_vptr_SPxOut[2])(this->spxout,&result);
            }
            SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::coSolve(&this->
                       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,&this->theCoPvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,this->theCoPrhs);
            computePvec(this);
            computeCoTest(this);
            computeTest(this);
          }
        }
        else {
          pSVar28 = this->spxout;
          if ((pSVar28 != (SPxOut *)0x0) && (4 < (int)pSVar28->m_verbosity)) {
            result.m_backend.data._M_elems[0] = pSVar28->m_verbosity;
            leavebound.m_backend.data._M_elems[0] = 5;
            (*pSVar28->_vptr_SPxOut[2])();
            pSVar28 = operator<<(this->spxout,"IENTER01 factorization triggered in ");
            pSVar28 = operator<<(pSVar28,"enter() for feasibility test");
            std::endl<char,std::char_traits<char>>(pSVar28->m_streams[pSVar28->m_verbosity]);
            (*this->spxout->_vptr_SPxOut[2])(this->spxout,&result);
          }
          (*(this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x75])(this);
        }
      }
      goto LAB_00283a60;
    }
    DVar36 = *local_7b0;
    if (bVar24 == false) {
      (this->instableEnterId).super_DataKey = DVar36;
      *(ulong *)((this->instableEnterVal).m_backend.data._M_elems + 8) =
           CONCAT35(enterTest.m_backend.data._M_elems[9]._1_3_,
                    enterTest.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 4) =
           enterTest.m_backend.data._M_elems._16_8_;
      *(ulong *)((this->instableEnterVal).m_backend.data._M_elems + 6) =
           CONCAT44(enterTest.m_backend.data._M_elems[7],enterTest.m_backend.data._M_elems[6]);
      *(undefined8 *)(this->instableEnterVal).m_backend.data._M_elems =
           enterTest.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 2) =
           enterTest.m_backend.data._M_elems._8_8_;
      (this->instableEnterVal).m_backend.exp = enterTest.m_backend.exp;
      (this->instableEnterVal).m_backend.neg = enterTest.m_backend.neg;
      (this->instableEnterVal).m_backend.fpclass = enterTest.m_backend.fpclass;
      (this->instableEnterVal).m_backend.prec_elem = enterTest.m_backend.prec_elem;
      DVar36 = *local_7b0;
      pcVar32 = &result_17.m_backend;
      result_17.m_backend.fpclass = cpp_dec_float_finite;
      result_17.m_backend.prec_elem = 10;
      result_17.m_backend.data._M_elems[0] = 0;
      result_17.m_backend.data._M_elems[1] = 0;
      result_17.m_backend.data._M_elems[2] = 0;
      result_17.m_backend.data._M_elems[3] = 0;
      result_17.m_backend.data._M_elems[4] = 0;
      result_17.m_backend.data._M_elems[5] = 0;
      result_17.m_backend.data._M_elems._24_5_ = 0;
      result_17.m_backend.data._M_elems[7]._1_3_ = 0;
      result_17.m_backend.data._M_elems._32_5_ = 0;
      result_17.m_backend._37_8_ = 0;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result,10.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (pcVar32,&enterTest.m_backend,&result.m_backend);
      pp_Var29 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray;
    }
    else {
      local_268.data._M_elems[9]._1_3_ = enterTest.m_backend.data._M_elems[9]._1_3_;
      local_268.data._M_elems._32_5_ = enterTest.m_backend.data._M_elems._32_5_;
      pcVar32 = &local_268;
      local_268.data._M_elems[7] = enterTest.m_backend.data._M_elems[7];
      local_268.data._M_elems[6] = enterTest.m_backend.data._M_elems[6];
      local_268.data._M_elems[4] = enterTest.m_backend.data._M_elems[4];
      local_268.data._M_elems[5] = enterTest.m_backend.data._M_elems[5];
      local_268.data._M_elems[0] = enterTest.m_backend.data._M_elems[0];
      local_268.data._M_elems[1] = enterTest.m_backend.data._M_elems[1];
      local_268.data._M_elems[2] = enterTest.m_backend.data._M_elems[2];
      local_268.data._M_elems[3] = enterTest.m_backend.data._M_elems[3];
      local_268.exp = enterTest.m_backend.exp;
      local_268.neg = enterTest.m_backend.neg;
      local_268.fpclass = enterTest.m_backend.fpclass;
      local_268.prec_elem = enterTest.m_backend.prec_elem;
      pp_Var29 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray;
    }
    (*pp_Var29[0x84])(this,DVar36,pcVar32,(ulong)(uint)enterStat);
    pp_Var29 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
  }
  (**pp_Var29)(&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,0xffffffff,&none,0,0);
LAB_00283a60:
  return (bool)(char)uVar40;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}